

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicResourceImage::Cleanup(BasicResourceImage *this)

{
  int width;
  int height;
  BasicResourceImage *this_local;
  
  glu::CallLogWrapper::glUseProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_draw_program);
  glu::CallLogWrapper::glDeleteVertexArrays
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,1,&this->m_vertex_array);
  glu::CallLogWrapper::glDeleteTextures
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,2,this->m_texture);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,1,&this->m_dispatch_buffer);
  width = ComputeShaderBase::getWindowWidth(&this->super_ComputeShaderBase);
  height = ComputeShaderBase::getWindowHeight(&this->super_ComputeShaderBase);
  glu::CallLogWrapper::glViewport
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0,0,width,height);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glUseProgram(0);
		glDeleteProgram(m_program);
		glDeleteProgram(m_draw_program);
		glDeleteVertexArrays(1, &m_vertex_array);
		glDeleteTextures(2, m_texture);
		glDeleteBuffers(1, &m_dispatch_buffer);
		glViewport(0, 0, getWindowWidth(), getWindowHeight());
		return NO_ERROR;
	}